

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

const_iterator * __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::find<pstore::uint128,void>
          (const_iterator *__return_storage_ptr__,
          hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
          *this,database *db,uint128 *key)

{
  bool bVar1;
  address db_00;
  key_type *pkVar2;
  address addr;
  long extraout_RDX;
  ulong uVar3;
  uint uVar4;
  index_pointer node_00;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *phVar5;
  pair<pstore::index::details::index_pointer,_unsigned_long> pVar6;
  internal_node *internal;
  index_pointer node;
  shared_ptr<const_void> store_node;
  parent_stack parents;
  internal_node *local_170;
  index_pointer local_168;
  const_iterator *local_160;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_158;
  uint128 *local_150;
  internal_node **local_148;
  undefined8 *local_140;
  undefined8 local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_130 [2];
  index_pointer local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118 [2];
  array_stack<pstore::index::details::parent_type,_13UL> local_108;
  
  addr.a_ = (value_type)key;
  bVar1 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::empty((hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                   *)this);
  if (bVar1) {
    memset(&__return_storage_ptr__->visited_parents_,0,0xd8);
    __return_storage_ptr__->db_ = db;
    __return_storage_ptr__->index_ =
         (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *)this;
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
    ._M_head_impl = (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0;
  }
  else {
    uVar3 = *(ulong *)((long)&key->v_ + 8);
    node_00 = *(index_pointer *)(this + 0x18);
    uVar4 = 0;
    local_168 = node_00;
    local_160 = __return_storage_ptr__;
    local_158 = (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                 *)this;
    local_150 = key;
    memset(&local_108,0,0xd8);
    local_138 = 0;
    a_Stack_130[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while (((ulong)node_00.internal_ & 1) != 0) {
      if (uVar4 < 0x42) {
        local_170 = (internal_node *)0x0;
        details::internal_node::get_node
                  ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                    *)&local_120.addr_,db,node_00);
        local_148 = &local_170;
        local_140 = &local_138;
        std::tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>::
        operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>
                   *)&local_148,
                  (pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                   *)&local_120.addr_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_118);
        pVar6 = details::internal_node::lookup(local_170,(ulong)((uint)uVar3 & 0x3f));
      }
      else {
        local_170 = (internal_node *)0x0;
        details::linear_node::get_node
                  ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                    *)&local_120.addr_,db,node_00);
        local_148 = &local_170;
        local_140 = &local_138;
        std::tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&>::
        operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&> *
                  )&local_148,
                  (pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                   *)&local_120.addr_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_118);
        pVar6 = (pair<pstore::index::details::index_pointer,_unsigned_long>)
                details::linear_node::
                lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
                          ((linear_node *)local_170,db,local_150);
      }
      __return_storage_ptr__ = local_160;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar6.second ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
        memset(&local_160->visited_parents_,0,0xd8);
        __return_storage_ptr__->db_ = db;
        phVar5 = local_158;
        goto LAB_001a26ec;
      }
      local_120 = node_00;
      local_118[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar6.second;
      array_stack<pstore::index::details::parent_type,_13UL>::push
                (&local_108,(value_type *)&local_120.addr_);
      uVar4 = uVar4 + 6;
      uVar3 = uVar3 >> 6;
      node_00 = pVar6.first;
      local_168 = pVar6.first;
    }
    db_00 = details::index_pointer::to_address((index_pointer *)&local_168.addr_);
    phVar5 = local_158;
    pkVar2 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             ::get_key((key_type *)local_158,
                       (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                        *)db,(database *)db_00.a_,addr);
    __return_storage_ptr__ = local_160;
    if (extraout_RDX == *(long *)((long)&local_150->v_ + 8) &&
        pkVar2 == *(key_type **)&local_150->v_) {
      local_120 = local_168;
      local_118[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
      array_stack<pstore::index::details::parent_type,_13UL>::push
                (&local_108,(value_type *)&local_120.addr_);
      __return_storage_ptr__->db_ = db;
      memcpy(&__return_storage_ptr__->visited_parents_,&local_108,0xd8);
    }
    else {
      memset(&local_160->visited_parents_,0,0xd8);
      __return_storage_ptr__->db_ = db;
    }
LAB_001a26ec:
    __return_storage_ptr__->index_ = phVar5;
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
    ._M_head_impl = (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_130);
  }
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::find (database const & db,
                                                                 OtherKeyType const & key) const
            -> const_iterator {
            if (empty ()) {
                return this->cend (db);
            }

            auto hash = static_cast<hash_type> (hash_ (key));
            unsigned bit_shifts = 0;
            index_pointer node = root_;
            parent_stack parents;

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                index_pointer child_node;
                auto index = std::size_t{0};

                if (details::depth_is_internal_node (bit_shifts)) {
                    // It's an internal node.
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db, node);
                    std::tie (child_node, index) =
                        internal->lookup (hash & details::hash_index_mask);
                } else {
                    // It's a linear node.
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db, node);
                    std::tie (child_node, index) = linear->lookup<KeyType> (db, key, equal_);
                }

                if (index == details::not_found) {
                    return this->cend (db);
                }
                parents.push (details::parent_type{node, index});

                // Go to next sub-trie level
                node = child_node;
                bit_shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
            }
            // It's a leaf node.
            PSTORE_ASSERT (node.is_leaf ());
            key_type const existing_key = get_key (db, node.to_address ());
            if (equal_ (existing_key, key)) {
                parents.push (details::parent_type{node});
                return const_iterator (db, std::move (parents), this);
            }
            return this->cend (db);
        }